

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callbacks.cpp
# Opt level: O0

IDeckLinkVideoOutputCallback *
cdecklink_internal_callback_create_deck_link_video_output_callback
          (void *ctx,cdecklink_video_output_callback_scheduled_frame_completed *cb0,
          cdecklink_video_output_callback_scheduled_playback_has_stopped *cb1)

{
  cdecklink_video_output_callback_scheduled_playback_has_stopped *cb1_local;
  cdecklink_video_output_callback_scheduled_frame_completed *cb0_local;
  void *ctx_local;
  
  if ((cb0 == (cdecklink_video_output_callback_scheduled_frame_completed *)0x0) &&
     (cb1 == (cdecklink_video_output_callback_scheduled_playback_has_stopped *)0x0)) {
    ctx_local = (void *)0x0;
  }
  else {
    ctx_local = operator_new(0x28);
    DeckLinkVideoOutputCallback::DeckLinkVideoOutputCallback
              ((DeckLinkVideoOutputCallback *)ctx_local,ctx,cb0,cb1);
  }
  return (IDeckLinkVideoOutputCallback *)ctx_local;
}

Assistant:

IDeckLinkVideoOutputCallback* cdecklink_internal_callback_create_deck_link_video_output_callback (void *ctx, cdecklink_video_output_callback_scheduled_frame_completed *cb0, cdecklink_video_output_callback_scheduled_playback_has_stopped *cb1) {
	if (cb0 != nullptr || cb1 != nullptr) {
		return new DeckLinkVideoOutputCallback(ctx, cb0, cb1);
	}
	return nullptr;
}